

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O1

HT_CPUUsageContext * ht_cpu_usage_context_create(void *process_id)

{
  int iVar1;
  __pid_t _Var2;
  HT_CPUUsageContext *context;
  
  iVar1 = pthread_once(&_clock_ticks_per_sec_once_control,_init_clock_ticks_per_sec);
  if (iVar1 == 0) {
    if (realloc_fnc_ == (realloc_function)0x0) {
      context = (HT_CPUUsageContext *)malloc(0x18);
    }
    else {
      context = (HT_CPUUsageContext *)(*realloc_fnc_)((void *)0x0,0x18,user_data_);
    }
    if (context != (HT_CPUUsageContext *)0x0) {
      context->last_probe = 0;
      if (process_id == (void *)0x0) {
        _Var2 = getpid();
      }
      else {
        _Var2 = *process_id;
      }
      context->pid = _Var2;
      context->last_total_time = 0;
      ht_cpu_usage_get_percentage(context);
      context->value = 0.0;
      return context;
    }
  }
  return (HT_CPUUsageContext *)0x0;
}

Assistant:

HT_CPUUsageContext*
ht_cpu_usage_context_create(void* process_id)
{
    HT_CPUUsageContext* context = NULL;

    int status = pthread_once(&_clock_ticks_per_sec_once_control, _init_clock_ticks_per_sec);

    if (status != 0)
    {
        return NULL;
    }

    context = HT_CREATE_TYPE(HT_CPUUsageContext);

    if (context == NULL)
    {
        return NULL;
    }

    context->last_probe = 0;
    context->pid = process_id == NULL ? getpid() : *(int*)process_id;
    context->last_total_time = 0;

    ht_cpu_usage_get_percentage(context);
    context->value = 0.0f;

    return context;
}